

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O2

Result * validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkClassifier>
                   (Result *__return_storage_ptr__,ModelDescription *interface,
                   NeuralNetworkClassifier *nn,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *outputBlobNames,bool isUpdatable,ValidationPolicy *validationPolicy)

{
  void **ppvVar1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  uint uVar4;
  mapped_type mVar5;
  void *pvVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  mapped_type *pmVar10;
  Rep *pRVar11;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this;
  Result *this_00;
  iterator iVar12;
  _Base_ptr p_Var13;
  int iVar14;
  long lVar15;
  long lVar16;
  void **ppvVar17;
  undefined1 *puVar18;
  key_type *__k;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  NeuralNetworkSpecValidator validator;
  Result r;
  NeuralNetworkShaper shaper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ioBlobNameToRank;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  inputBlobs;
  
  CoreML::Result::Result(&r);
  pRVar11 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar11 != (Rep *)0x0) {
    pRVar11 = (Rep *)pRVar11->elements;
  }
  lVar16 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_ * 8;
  lVar20 = 0;
  do {
    lVar19 = lVar20;
    if (lVar16 == lVar19) break;
    puVar18 = *(undefined1 **)(*(long *)((long)pRVar11->elements + lVar19 + -8) + 0x20);
    if (puVar18 == (undefined1 *)0x0) {
      puVar18 = CoreML::Specification::_FeatureType_default_instance_;
    }
    lVar20 = lVar19 + 8;
  } while (*(int *)(puVar18 + 0x24) != 5);
  iVar14 = nn->arrayinputshapemapping_;
  iVar3 = nn->imageinputshapemapping_;
  pRVar11 = (nn->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar11 != (Rep *)0x0) {
    pRVar11 = (Rep *)pRVar11->elements;
  }
  lVar21 = (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_ * 8;
  lVar20 = 0;
  do {
    lVar15 = lVar20;
    if (lVar21 == lVar15) break;
    bVar8 = CoreML::isIOS12NeuralNetworkLayer
                      (*(NeuralNetworkLayer **)((long)pRVar11->elements + lVar15 + -8));
    lVar20 = lVar15 + 8;
  } while (bVar8);
  bVar22 = lVar21 != lVar15;
  bVar8 = iVar14 != 0;
  bVar7 = iVar3 != 0;
  if (((lVar16 == lVar19) || (iVar14 != 0)) || (lVar21 == lVar15)) {
    if (((lVar16 == lVar19) || (iVar14 != 0)) || (iVar3 == 0)) {
      uVar4 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
      if (uVar4 == 0 && validationPolicy->allowsEmptyInput == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&validator,"Neural networks require at least one input.",
                   (allocator<char> *)&shaper);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
      }
      else if ((interface->output_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&validator,"Neural networks produce at least one output.",
                   (allocator<char> *)&shaper);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
      }
      else {
        if ((nn->layers_).super_RepeatedPtrFieldBase.current_size_ != 0) {
          if (0 < (int)uVar4) {
            pRVar11 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
            ppvVar17 = pRVar11->elements;
            if (pRVar11 == (Rep *)0x0) {
              ppvVar17 = (void **)0x0;
            }
            bVar9 = std::
                    all_of<google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription_const>,validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkClassifier>(CoreML::Specification::ModelDescription_const&,CoreML::Specification::NeuralNetworkClassifier_const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&,bool,CoreML::ValidationPolicy_const&)::_lambda(CoreML::Specification::FeatureDescription_const&)_1_>
                              (ppvVar17,ppvVar17 + uVar4);
            if (bVar9) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&validator,
                         "Neural networks require at least one non-optional input.",
                         (allocator<char> *)&shaper);
              CoreML::Result::Result
                        (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
              goto LAB_00276be4;
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&validator,"inputs",(allocator<char> *)&shaper);
          CoreML::validateInputOutputTypes
                    (__return_storage_ptr__,&interface->input_,MODEL_INPUT_TYPE_INVALID,
                     (string *)&validator);
          std::__cxx11::string::~string((string *)&validator);
          bVar9 = CoreML::Result::good(__return_storage_ptr__);
          if (bVar9) {
            std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
            ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header;
            ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
            ;
            ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            pRVar11 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
            iVar14 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
            ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((bVar8 || bVar7) || bVar22) {
              ppvVar17 = pRVar11->elements;
              if (pRVar11 == (Rep *)0x0) {
                ppvVar17 = (void **)0x0;
              }
              for (lVar20 = 0; (long)iVar14 * 8 != lVar20; lVar20 = lVar20 + 8) {
                lVar16 = *(long *)((long)ppvVar17 + lVar20);
                puVar18 = *(undefined1 **)(lVar16 + 0x20);
                if (puVar18 == (undefined1 *)0x0) {
                  puVar18 = CoreML::Specification::_FeatureType_default_instance_;
                }
                if (*(int *)(puVar18 + 0x24) == 4) {
                  __k = (key_type *)(*(ulong *)(lVar16 + 0x10) & 0xfffffffffffffffe);
                  if (nn->imageinputshapemapping_ == 0) {
                    pmVar10 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](&ioBlobNameToRank,__k);
LAB_00276bac:
                    *pmVar10 = 5;
                  }
                  else {
                    pmVar10 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](&ioBlobNameToRank,__k);
                    *pmVar10 = 4;
                  }
                }
                else if (*(int *)(puVar18 + 0x24) == 5) {
                  if (nn->arrayinputshapemapping_ == 0) {
                    pmVar10 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](&ioBlobNameToRank,
                                           (key_type *)
                                           (*(ulong *)(lVar16 + 0x10) & 0xfffffffffffffffe));
                    goto LAB_00276bac;
                  }
                  mVar5 = *(mapped_type *)(*(long *)(puVar18 + 0x18) + 0x10);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::operator[](&ioBlobNameToRank,
                                         (key_type *)
                                         (*(ulong *)(lVar16 + 0x10) & 0xfffffffffffffffe));
                  *pmVar10 = mVar5;
                }
              }
              pRVar11 = (interface->output_).super_RepeatedPtrFieldBase.rep_;
              ppvVar17 = pRVar11->elements;
              if (pRVar11 == (Rep *)0x0) {
                ppvVar17 = (void **)0x0;
              }
              iVar14 = (interface->output_).super_RepeatedPtrFieldBase.current_size_;
              for (lVar20 = 0; (long)iVar14 * 8 != lVar20; lVar20 = lVar20 + 8) {
                puVar18 = *(undefined1 **)(*(long *)((long)ppvVar17 + lVar20) + 0x20);
                if (puVar18 == (undefined1 *)0x0) {
                  puVar18 = CoreML::Specification::_FeatureType_default_instance_;
                }
                if ((*(int *)(puVar18 + 0x24) == 5) &&
                   (iVar3 = *(int *)(*(long *)(puVar18 + 0x18) + 0x10), iVar3 != 0)) {
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::operator[](&ioBlobNameToRank,
                                         (key_type *)
                                         (*(ulong *)(*(long *)((long)ppvVar17 + lVar20) + 0x10) &
                                         0xfffffffffffffffe));
                  *pmVar10 = iVar3;
                }
              }
              pRVar11 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
            }
            p_Var2 = &inputBlobs._M_t._M_impl.super__Rb_tree_header;
            inputBlobs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            inputBlobs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            inputBlobs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            ppvVar17 = pRVar11->elements;
            if (pRVar11 == (Rep *)0x0) {
              ppvVar17 = (void **)0x0;
            }
            ppvVar1 = ppvVar17 + iVar14;
            inputBlobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
            inputBlobs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
            for (; ppvVar17 != ppvVar1; ppvVar17 = ppvVar17 + 1) {
              pvVar6 = *ppvVar17;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&validator,"__input",(allocator<char> *)&shaper);
              this = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[](&inputBlobs,
                                     (key_type *)
                                     (*(ulong *)((long)pvVar6 + 0x10) & 0xfffffffffffffffe));
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_assign_unique<std::__cxx11::string_const*>
                        (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &validator,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &validator.ModelIOBlobNameToRank._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_left);
              std::__cxx11::string::~string((string *)&validator);
              puVar18 = *(undefined1 **)((long)pvVar6 + 0x20);
              if (puVar18 == (undefined1 *)0x0) {
                puVar18 = CoreML::Specification::_FeatureType_default_instance_;
              }
              if (*(int *)(puVar18 + 0x24) == 5) {
                if ((bVar8 || bVar7) || bVar22) {
                  CoreML::validateNdMultiArrayInputType
                            ((Result *)&validator,*(ArrayFeatureType **)(puVar18 + 0x18));
                  this_00 = CoreML::Result::operator=(&r,(Result *)&validator);
                  bVar9 = CoreML::Result::good(this_00);
                  std::__cxx11::string::~string((string *)&validator.ModelIOBlobNameToRank);
                  if (!bVar9) {
                    CoreML::Result::Result(__return_storage_ptr__,&r);
                    goto LAB_00276fa5;
                  }
                }
                else {
                  lVar20 = *(long *)(puVar18 + 0x18);
                  uVar4 = *(uint *)(lVar20 + 0x10);
                  if ((0 < (int)uVar4) && ((uVar4 | 2) != 3)) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&validator,
                               "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                               ,(allocator<char> *)&shaper);
                    CoreML::Result::Result
                              (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
LAB_0027702a:
                    std::__cxx11::string::~string((string *)&validator);
                    goto LAB_00276fa5;
                  }
                  iVar14 = *(int *)(lVar20 + 0x3c);
                  if (iVar14 == 0) {
LAB_00276de9:
                    if ((int)uVar4 < 1) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&validator,
                                 "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                                 ,(allocator<char> *)&shaper);
                      CoreML::Result::Result
                                (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator
                                );
                      goto LAB_0027702a;
                    }
                  }
                  else if (iVar14 == 0x1f) {
                    if ((*(uint *)(*(long *)(lVar20 + 0x28) + 0x18) | 2) != 3) goto LAB_00276de9;
                  }
                  else if (iVar14 == 0x15) {
                    lVar19 = *(long *)(*(long *)(lVar20 + 0x28) + 0x20);
                    lVar16 = lVar19 + 8;
                    if (lVar19 == 0) {
                      lVar16 = 0;
                    }
                    for (lVar19 = 0; (long)*(int *)(*(long *)(lVar20 + 0x28) + 0x18) * 8 != lVar19;
                        lVar19 = lVar19 + 8) {
                      if ((*(uint *)(*(long *)(lVar16 + lVar19) + 0x10) | 2) != 3)
                      goto LAB_00276de9;
                    }
                  }
                }
              }
            }
            CoreML::NeuralNetworkSpecValidator::NeuralNetworkSpecValidator
                      (&validator,&inputBlobs,&ioBlobNameToRank,(bVar8 || bVar7) || bVar22,0,
                       &ioBlobNameToRank);
            CoreML::NeuralNetworkSpecValidator::
            validateNeuralNetwork<CoreML::Specification::NeuralNetworkClassifier>
                      ((Result *)&shaper,&validator,nn);
            CoreML::Result::operator=(&r,(Result *)&shaper);
            std::__cxx11::string::~string((string *)&shaper.blobColors);
            bVar9 = CoreML::Result::good(&r);
            if (bVar9) {
              for (p_Var13 = validator.blobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var13 != &validator.blobs._M_t._M_impl.super__Rb_tree_header;
                  p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
                iVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::find(&inputBlobs._M_t,(key_type *)(p_Var13 + 1));
                if (((_Rb_tree_header *)iVar12._M_node == p_Var2) ||
                   ((_Base_ptr)0x1 < p_Var13[3]._M_parent)) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)outputBlobNames,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var13 + 1));
                }
              }
              if ((!bVar8 && !bVar7) && !bVar22) {
                CoreML::NeuralNetworkShaper::NeuralNetworkShaper
                          (&shaper,interface,&nn->layers_,true);
                CoreML::NeuralNetworkShaper::~NeuralNetworkShaper(&shaper);
              }
              bVar8 = CoreML::Result::good(&r);
              if (bVar8 && isUpdatable) {
                validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetworkClassifier>
                          ((Result *)&shaper,nn);
                CoreML::Result::operator=(&r,(Result *)&shaper);
                std::__cxx11::string::~string((string *)&shaper.blobColors);
                bVar8 = CoreML::Result::good(&r);
                if (bVar8) {
                  validateTrainingInputs<CoreML::Specification::NeuralNetworkClassifier>
                            ((Result *)&shaper,interface,nn);
                  CoreML::Result::operator=(&r,(Result *)&shaper);
                  std::__cxx11::string::~string((string *)&shaper.blobColors);
                  CoreML::Result::good(&r);
                }
              }
            }
            CoreML::Result::Result(__return_storage_ptr__,&r);
            CoreML::NeuralNetworkSpecValidator::~NeuralNetworkSpecValidator(&validator);
LAB_00276fa5:
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&inputBlobs._M_t);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree(&ioBlobNameToRank._M_t);
          }
          goto LAB_00276bee;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&validator,"Neural networks require at least one layer.",
                   (allocator<char> *)&shaper);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&validator)
        ;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&validator,
                 "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the image input Shape mapping is not \'RANK5_IMAGE_MAPPING\'"
                 ,(allocator<char> *)&shaper);
      CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&validator,
               "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the network contains a layer added in version 4 (iOS 13) or later. Use \'EXACT_ARRAY_MAPPING\' instead."
               ,(allocator<char> *)&shaper);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
  }
LAB_00276be4:
  std::__cxx11::string::~string((string *)&validator);
LAB_00276bee:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validateNeuralNetworkTopLevel(const Specification::ModelDescription& interface,
                                     const T& nn, std::set<std::string>& outputBlobNames,
                                     bool isUpdatable,
                                     const ValidationPolicy& validationPolicy) {
    Result r;

    // First calculate the value of the flag "ndArrayInterpretation"
    // ndArrayInterpretation == False ==> iOS 11/12 (old) execution path can be used, i.e. all tensors are static rank 5.
    // ndArrayInterpretation == True ==>  Tensors can have any rank (including 5).

    bool ndArrayInterpretation = false;

    bool hasNonIOS12Layer = false;
    bool hasNewArrayShapeMapping = false;
    bool hasNewImageShapeMapping = false;
    bool hasMultiArrayInput = false;

    for (const auto& input: interface.input()) {
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            hasMultiArrayInput = true;
            break;
        }
    }

    if (nn.arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
        hasNewArrayShapeMapping = true;
    }

    if (nn.imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
        hasNewImageShapeMapping = true;
    }

    for (const auto &layer: nn.layers()) {
        if (!isIOS12NeuralNetworkLayer(layer)) {
            hasNonIOS12Layer = true;
            break;
        }
    }

    if (hasNonIOS12Layer || hasNewArrayShapeMapping || hasNewImageShapeMapping) {
        ndArrayInterpretation = true;
    }

    if (hasNonIOS12Layer && !hasNewArrayShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the network contains a layer added in version 4 (iOS 13) or later. Use 'EXACT_ARRAY_MAPPING' instead.");
    }

    if (!hasNewArrayShapeMapping && hasNewImageShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the image input Shape mapping is not 'RANK5_IMAGE_MAPPING'");
    }

    //==================== End of logic to determine the value of "ndArrayInterpretation" ======================

    if (!validationPolicy.allowsEmptyInput && interface.input_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks require at least one input.");
    }

    if (interface.output_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks produce at least one output.");
    }

    if (nn.layers().size() == 0) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "Neural networks require at least one layer.");
    }

    if (interface.input_size() > 0 && std::all_of(interface.input().begin(), interface.input().end(),
                    [](const Specification::FeatureDescription& input) {
                        if (input.type().Type_case() == Specification::FeatureType::kStateType)
                            return true; // ignores optionality for State type (which is always non-optional).
                        else
                            return input.type().isoptional();
                    })) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Neural networks require at least one non-optional input.");
                    }

    // Check the input types
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputTypes(interface.input(), ResultReason::MODEL_INPUT_TYPE_INVALID, "inputs"));

    std::map<std::string, int> ioBlobNameToRank; // to collect ranks of input/output blobs from the shapes present in the description

    // populate "ioBlobNameToRank"
    if (ndArrayInterpretation) {
        for (const auto& input: interface.input()) {
            if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (nn.arrayinputshapemapping() == Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = input.type().multiarraytype().shape_size();
                }
            } else if (input.type().Type_case() == Specification::FeatureType::kImageType) {
                if (nn.imageinputshapemapping() == Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = 4;
                }
            }
        }
        for (const auto& output: interface.output()) {
            if (output.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (output.type().multiarraytype().shape_size()) {
                    ioBlobNameToRank[output.name()] = output.type().multiarraytype().shape_size();
                }
            }
        }
    }

    // Collect Model input names and do some checking

    // inputBlobs: For each named data blob, the name of the node which produced it (there can be multiple in if-else branches)
    std::map<std::string, std::set<std::string>> inputBlobs;
    for (const auto& input: interface.input()) {
        // For input blobs, we'll give them a dummy producing layer name
        inputBlobs[input.name()] = {"__input"};
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {

            if (!ndArrayInterpretation) {

                // only vector-like (rank 1) or image-like (rank 3) inputs are allowed
                bool validShapeFound = false;
                if (input.type().multiarraytype().shape().size() > 0) {
                    if (!(input.type().multiarraytype().shape().size() == 1
                          || input.type().multiarraytype().shape().size() == 3)) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                    }
                    else {
                        validShapeFound = true;
                    }
                }
                bool flexibilityIsRank1or3 = true;
                switch (input.type().multiarraytype().ShapeFlexibility_case()) {
                    case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
                        for (const auto &shape : input.type().multiarraytype().enumeratedshapes().shapes()) {
                            if(shape.shape_size() != 1 && shape.shape_size() != 3) {
                                flexibilityIsRank1or3 = false;
                                break;
                            }
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kShapeRange:
                        flexibilityIsRank1or3 = (input.type().multiarraytype().shaperange().sizeranges_size() == 1 ||
                                                 input.type().multiarraytype().shaperange().sizeranges_size() == 3);
                        break;
                    case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                        flexibilityIsRank1or3 = false;
                        break;
                }
                if (!flexibilityIsRank1or3 && !validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                } else if (flexibilityIsRank1or3) {
                    validShapeFound = true;
                }
                if (!validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                }

            } else { // validate input shape when "ndArrayInterpretation" is True

                if (!(r = validateNdMultiArrayInputType(input.type().multiarraytype())).good()) {
                    return r;
                }
            } // if else block on spec version to check validity of input shape
        }
    }

    // validate the Neural Network message

    //  create an object to validate neural network message
    NeuralNetworkSpecValidator validator(inputBlobs, ioBlobNameToRank, ndArrayInterpretation, 0, ioBlobNameToRank);

    r = validator.validateNeuralNetwork(nn);

    if (!r.good()) {
        return r;
    }

    // gather all output blobs of the graph
    for (auto& blob: validator.blobs){
        if (inputBlobs.find(blob.first) == inputBlobs.end()) {
            outputBlobNames.insert(blob.first);
        } else {
            // if we are here, this means this blob is also present in the set of "inputBlobs"
            // but it can still be a genuine output blob if multiple layers are generating it (e.g. copy layer)
            if (blob.second.size() > 1) {
                outputBlobNames.insert(blob.first);
            }
        }
    }

    // Call the shaper: compatibility with iOS 12
    if (!ndArrayInterpretation) {
        // Compute the shapes
        try {
            NeuralNetworkShaper shaper(interface, nn.layers());
        }
        catch(std::runtime_error& e) {
            std::string err = std::string("Error determining network blob shapes: ") + std::string(e.what());
            return Result(ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES, err);
        }
    }

    if (!r.good()) {
        return r;
    }

    if (isUpdatable) {
        r = validateUpdatableNeuralNetwork(nn);
        if (!r.good()) { return r; }

        r = validateTrainingInputs(interface, nn);
        if (!r.good()) { return r; }
    }

    return r;

}